

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<MPL::ModelPackage> * __thiscall
pybind11::class_<MPL::ModelPackage>::
def<std::shared_ptr<MPL::ModelPackageItemInfo>(MPL::ModelPackage::*)()const>
          (class_<MPL::ModelPackage> *this,char *name_,offset_in_ModelPackageItemInfo_to_subr *f)

{
  offset_in_ModelPackageItemInfo_to_subr f_00;
  name *extra;
  handle obj;
  cpp_function cf;
  object local_60;
  cpp_function local_58;
  handle local_50;
  sibling local_48;
  is_method local_40;
  handle local_38;
  
  f_00 = *f;
  extra = (name *)f[1];
  obj.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_48.value.m_ptr = (handle)(handle)obj.m_ptr;
  local_40.class_.m_ptr = (handle)(handle)name_;
  none::none((none *)&local_50);
  getattr((pybind11 *)&local_60,obj,name_,local_50);
  local_38 = local_60.super_handle.m_ptr;
  cpp_function::
  cpp_function<std::shared_ptr<MPL::ModelPackageItemInfo>,MPL::ModelPackage,,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_58,f_00,extra,&local_40,&local_48);
  object::~object(&local_60);
  object::~object((object *)&local_50);
  detail::add_class_method((object *)this,name_,&local_58);
  object::~object((object *)&local_58);
  return this;
}

Assistant:

class_ &def(const char *name_, Func &&f, const Extra &...extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)),
                        name(name_),
                        is_method(*this),
                        sibling(getattr(*this, name_, none())),
                        extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }